

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::IntStateScatterReactions
          (ChLinkRevoluteTranslational *this,uint off_L,ChVectorDynamic<> *L)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  undefined1 auVar4 [32];
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 == '\0') {
    return;
  }
  uVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < (long)uVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    this->m_multipliers[0] = pdVar2[off_L];
    if (off_L + 1 < uVar1) {
      this->m_multipliers[1] = pdVar2[off_L + 1];
      if (off_L + 2 < uVar1) {
        this->m_multipliers[2] = pdVar2[off_L + 2];
        if (off_L + 3 < uVar1) {
          this->m_multipliers[3] = pdVar2[off_L + 3];
          auVar4 = ZEXT832(0) << 0x20;
          (this->super_ChLink).react_force = (ChVector<double>)auVar4._0_24_;
          (this->super_ChLink).react_torque.m_data[0] = (double)auVar4._24_8_;
          *(undefined1 (*) [32])((this->super_ChLink).react_force.m_data + 2) = auVar4;
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkRevoluteTranslational::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    m_multipliers[0] = L(off_L + 0);
    m_multipliers[1] = L(off_L + 1);
    m_multipliers[2] = L(off_L + 2);
    m_multipliers[3] = L(off_L + 3);

    // Also compute 'intuitive' reactions:
    ////double lam_par1 = m_multipliers[0];
    ////double lam_par2 = m_multipliers[1];
    ////double lam_dot = m_multipliers[2];
    ////double lam_dist = m_multipliers[3];

    ////
    //// TODO
    ////

    // Calculate the reaction torques and forces on Body 2 in the joint frame
    // (Note: origin of the joint frame is at the center of the revolute joint
    //  which is defined on body 1, the x-axis is along the vector from the
    //  point on body 1 to the point on body 2.  The z axis is along the revolute
    //  axis defined for the joint)
    react_force.x() = 0;
    react_force.y() = 0;
    react_force.z() = 0;

    react_torque.x() = 0;
    react_torque.y() = 0;
    react_torque.z() = 0;
}